

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int buffer_close(buffer_t *buffer)

{
  int iVar1;
  uint local_1c;
  int status;
  buffer_t *buffer_local;
  
  if (buffer->f < 0) {
    g_hash_table_unref(buffer->comments);
    if (buffer->highlights != (GSList *)0x0) {
      g_slist_free_full(buffer->highlights,g_free);
    }
    buffer_local._4_4_ = 0;
  }
  else {
    iVar1 = munmap(buffer->data,buffer->size);
    if (iVar1 != 0) {
      perror("munmap");
    }
    local_1c = (uint)(iVar1 != 0);
    iVar1 = close(buffer->f);
    if (iVar1 != 0) {
      perror("close");
      local_1c = 1;
    }
    g_hash_table_unref(buffer->comments);
    if (buffer->highlights != (GSList *)0x0) {
      g_slist_free_full(buffer->highlights,g_free);
    }
    free(buffer->path);
    buffer_local._4_4_ = local_1c;
  }
  return buffer_local._4_4_;
}

Assistant:

int
buffer_close(buffer_t *buffer)
{
    if (buffer->f < 0) {
        g_hash_table_unref(buffer->comments);
        if (buffer->highlights) {
            g_slist_free_full(buffer->highlights, g_free);
        }
        return 0;
    }

    int status = 0;

    if (munmap(buffer->data, buffer->size) != 0) {
        perror("munmap");
        status = 1;
    }

    if (close(buffer->f) != 0) {
        perror("close");
        status = 1;
    }

    g_hash_table_unref(buffer->comments);
    if (buffer->highlights) {
        g_slist_free_full(buffer->highlights, g_free);
    }
    free((void*) buffer->path);
    return status;
}